

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O3

_Bool borg_flow_old(wchar_t why)

{
  borg_grid *pbVar1;
  borg_take *pbVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  ushort uVar6;
  loc_conflict grid2;
  chunk_conflict *pcVar7;
  _Bool _Var8;
  uint32_t uVar9;
  uint32_t uVar12;
  long lVar13;
  loc_conflict lVar14;
  uint uVar10;
  wchar_t wVar11;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  loc_conflict lVar18;
  loc lVar19;
  object *poVar20;
  uint uVar21;
  long lVar22;
  keycode_t kVar23;
  wchar_t wVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  borg_kill *pbVar31;
  wchar_t y2;
  uint local_34;
  
  if (borg.goal.type != why) {
    return false;
  }
  bVar3 = borg_data_flow->data[borg.c.y][borg.c.x];
  uVar10 = ((uint)bVar3 + (uint)bVar3 * 4) * 2 - 5;
  local_34 = 0xffffffff;
  lVar25 = 0;
  uVar12 = 0;
  do {
    sVar4 = ddx_ddd[lVar25];
    lVar22 = (long)borg.c.x + (long)sVar4;
    sVar5 = ddy_ddd[lVar25];
    lVar13 = (long)borg.c.y + (long)sVar5;
    uVar21 = (uint)borg_data_flow->data[lVar13][lVar22] * 10;
    if ((((int)uVar21 <= (int)uVar10) && (0xffffff3a < (int)lVar22 - 0xc6U)) &&
       (0xffffffbe < (int)lVar13 - 0x42U)) {
      uVar9 = uVar12;
      if (uVar21 < uVar10) {
        uVar9 = 0;
      }
      iVar27 = borg.trait[0x69];
      if (iVar27 == 0) {
        uVar12 = uVar9 + 1;
        if (0 < (int)uVar9) {
          uVar9 = Rand_div(uVar12);
          if (uVar9 != 0) goto LAB_00220d7a;
          iVar27 = borg.trait[0x69];
          uVar9 = uVar12;
          goto LAB_00220db9;
        }
      }
      else {
LAB_00220db9:
        uVar12 = uVar9;
        if ((0 < iVar27) && (uVar12 = uVar9 + 1, 0 < (int)uVar9)) goto LAB_00220d7a;
      }
      if ((borg.goal.type == 10) && (sVar4 == 0 || sVar5 == 0)) {
        lVar14 = loc((uint)borg_flow_x[0],(uint)borg_flow_y[0]);
        lVar18.y = borg.c.y;
        lVar18.x = borg.c.x;
        wVar24 = distance(lVar18,lVar14);
        if (wVar24 < L'\x03') goto LAB_00220d7a;
      }
      local_34 = (uint)lVar25;
      uVar10 = uVar21;
    }
LAB_00220d7a:
    lVar25 = lVar25 + 1;
  } while (lVar25 != 8);
  if ((int)local_34 < 0) {
LAB_00221063:
    if (((borg.goal.type == 10) && (borg.c.y == (uint)borg_flow_y[0])) &&
       (borg.c.x == (uint)borg_flow_x[0])) {
      borg_t_antisummon = (wchar_t)borg_t;
    }
    borg.goal.type = 0;
    return false;
  }
  wVar24 = ddx_ddd[local_34] + borg.c.x;
  if (breeder_level == true) {
    iVar27 = 0;
    uVar28 = 0xffffffffffffffff;
    uVar16 = 0;
    uVar26 = 0;
    do {
      lVar25 = uVar28 + (long)borg.c.x;
      uVar29 = 0xffffffffffffffff;
      do {
        if (((int)uVar29 != 0 || (int)uVar28 != 0) &&
           (borg_grids[(long)borg.c.y + uVar29][lVar25].feat == '\x03')) {
          if ((borg_grids[(long)borg.c.y + uVar29][lVar25].kill == '\0') &&
             ((track_door.num < 0xff &&
              ((int)ddy_ddd[local_34] != (int)uVar29 || wVar24 != (wchar_t)lVar25)))) {
            iVar27 = iVar27 + 1;
            uVar26 = uVar29 & 0xffffffff;
            uVar16 = uVar28 & 0xffffffff;
          }
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 != 2);
      uVar28 = uVar28 + 1;
    } while (uVar28 != 2);
    if (iVar27 != 0) {
      wVar24 = borg_goto_dir(borg.c.y,borg.c.x,(int)uVar26 + borg.c.y,(int)uVar16 + borg.c.x);
      iVar27 = ddx[wVar24] + borg.c.x;
      iVar30 = ddy[wVar24] + borg.c.y;
      borg.goal.g.x = iVar27;
      borg.goal.g.y = iVar30;
      borg_note("# Closing a door");
      borg_keypress(99);
      borg_queue_direction(wVar24 + L'0');
      uVar10 = (uint)track_door.num;
      uVar16 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar21 = 0;
      }
      else {
        uVar26 = 0;
        do {
          if ((track_door.x[uVar26] == iVar27) && (track_door.y[uVar26] == iVar30)) {
            return true;
          }
          uVar26 = uVar26 + 1;
          uVar21 = uVar10;
        } while (uVar16 != uVar26);
      }
      if (uVar21 != uVar10) {
        return true;
      }
      if ((int)uVar21 < (int)track_door.size) {
        borg_note("# Noting the closing of a door.");
        track_door.num = track_door.num + 1;
        track_door.x[uVar16] = iVar27;
        track_door.y[uVar16] = iVar30;
        return true;
      }
      return true;
    }
  }
  if (((borg.goal.less == true) && (borg_grids[borg.c.y][borg.c.x].feat == '\x05')) &&
     ((player->opts).opt[0x20] == false)) {
    borg.goal.less = false;
    kVar23 = 0x3c;
    goto LAB_002214c6;
  }
  y2 = ddy_ddd[local_34] + borg.c.y;
  wVar11 = borg_goto_dir(borg.c.y,borg.c.x,y2,wVar24);
  pbVar31 = borg_kills;
  if (wVar11 == L'\x05') goto LAB_00221063;
  lVar25 = (long)ddx[wVar11] + (long)borg.c.x;
  borg.goal.g.x = (int)lVar25;
  borg.goal.g.y = (int)((long)ddy[wVar11] + (long)borg.c.y);
  uVar16 = (ulong)borg_grids[(long)ddy[wVar11] + (long)borg.c.y][lVar25].kill;
  if (uVar16 == 0) {
    pbVar1 = borg_grids[(long)ddy[wVar11] + (long)borg.c.y] + lVar25;
    uVar16 = (ulong)pbVar1->take;
    if ((uVar16 == 0) || (borg_takes[uVar16].kind == (object_kind *)0x0)) {
      if (pbVar1->glyph == true) {
        pcVar15 = format("# Walking onto a glyph of warding.");
      }
      else {
        if (((borg.trait[0x1a] != 0) && (borg.trait[0x70] == 0)) &&
           ((borg.trait[0x72] == 0 && ((scaryguy_on_level == false && (pbVar1->trap == true)))))) {
          _Var8 = borg_activate_item(act_disable_traps);
          if (_Var8) {
            borg_note("# Activation to Disable Traps, Destroy Doors");
            pbVar1->trap = false;
            borg.no_rest_prep = 3000;
            lVar14.y = borg.goal.g.y;
            lVar14.x = borg.goal.g.x;
            borg_target(lVar14);
            return true;
          }
          if (((borg.trait[0x1f] << 2) / 5 < borg.trait[0x1e]) &&
             (_Var8 = borg_spell(DISABLE_TRAPS_DESTROY_DOORS), _Var8)) {
            borg_note("# Disable Traps, Destroy Doors");
            pbVar1->trap = false;
            borg.no_rest_prep = 3000;
            return true;
          }
          borg_note("# Disarming a trap");
          borg_keypress(0x44);
          borg_queue_direction(wVar11 + L'0');
          pbVar1->trap = false;
          return true;
        }
        bVar3 = pbVar1->feat;
        if (bVar3 == 0x17) {
          if (borg.trait[0x40] == 0) goto LAB_00221063;
        }
        else {
          if (bVar3 == 0x16) goto LAB_00221063;
          if (bVar3 == 2) {
            uVar12 = Rand_div(100);
            if (uVar12 == 0) goto LAB_00221063;
            lVar25 = 0;
            do {
              if (((borg_grids[(long)ddy_ddd[lVar25] + (long)borg.c.y]
                    [(long)ddx_ddd[lVar25] + (long)borg.c.x].kill != '\0') &&
                  (borg.trait[0x23] < 0xf)) && (borg.trait[0x71] == 0)) goto LAB_00221063;
              lVar25 = lVar25 + 1;
            } while (lVar25 != 8);
            uVar12 = Rand_div(100);
            if ((uVar12 == 0) || (499 < borg.time_this_panel)) {
              _Var8 = borg_spell(DISABLE_TRAPS_DESTROY_DOORS);
              if ((_Var8) || (_Var8 = borg_activate_item(act_destroy_doors), _Var8)) {
                borg_note("# Disable Traps, Destroy Doors");
                return true;
              }
              _Var8 = borg_spell(TURN_STONE_TO_MUD);
              if ((((_Var8) || (_Var8 = borg_spell(SHATTER_STONE), _Var8)) ||
                  (_Var8 = borg_activate_ring(sv_ring_digging), _Var8)) ||
                 (_Var8 = borg_activate_item(act_stone_to_mud), _Var8)) {
                borg_note("# Melting a door");
                borg_keypress(wVar11 + L'0');
                goto LAB_00221817;
              }
            }
            if (my_need_alter == true) {
              borg_keypress(0x2b);
              my_need_alter = false;
            }
            else {
              borg_note("# Opening a door");
              borg_keypress(0x6f);
            }
            borg_queue_direction(wVar11 + L'0');
LAB_00221817:
            if (track_closed.num != 0) {
              track_closed.num = 0;
              return true;
            }
            return true;
          }
          if ((byte)(bVar3 - 0xf) < 7) {
            if ((bVar3 != 0x10) && (borg.goal.type == 4)) {
              borg.goal.type = 0;
              return false;
            }
            _Var8 = borg_can_dig(false,bVar3);
            if (!_Var8) {
              borg.goal.type = 0;
              return false;
            }
            _Var8 = borg_spell(TURN_STONE_TO_MUD);
            if ((((_Var8) || (_Var8 = borg_spell(SHATTER_STONE), _Var8)) ||
                (_Var8 = borg_activate_ring(sv_ring_digging), _Var8)) ||
               (_Var8 = borg_activate_item(act_stone_to_mud), _Var8)) {
              borg_note("# Melting a wall/etc");
            }
            else {
              uVar12 = Rand_div(500);
              if (((int)uVar12 < 6) && (vault_on_level != true)) goto LAB_00221063;
              borg_note("# Digging through wall/etc");
              borg_keypress(0x54);
            }
            borg_keypress(wVar11 + L'0');
            track_vein.num = 0;
            return true;
          }
        }
        _Var8 = feat_is_shop((uint)bVar3);
        if (!_Var8) {
          if (my_need_alter == true) {
            borg_keypress(0x2b);
            my_need_alter = false;
          }
          borg_keypress(wVar11 + L'0');
          borg.in_shop = false;
          return true;
        }
        pcVar15 = format("# Entering a \'%d\' shop",(ulong)pbVar1->store);
      }
      borg_note(pcVar15);
    }
    else {
      pbVar2 = borg_takes + uVar16;
      pcVar15 = (borg_takes[uVar16].kind)->name;
      pcVar17 = strstr(pcVar15,"chest");
      if ((pcVar17 == (char *)0x0) ||
         (pcVar15 = strstr(pcVar15,"Ruined"), pcVar7 = cave, pcVar15 != (char *)0x0))
      goto LAB_002212b0;
      lVar19 = (loc)loc(wVar24,y2);
      poVar20 = borg_get_top_object((chunk_conflict1 *)pcVar7,lVar19);
      if (poVar20 == (object *)0x0) {
        borg_delete_take((uint)pbVar1->take);
        goto LAB_00221063;
      }
      sVar4 = poVar20->pval;
      if (sVar4 < 2) {
        if ((sVar4 < 0) || (poVar20->known == (object *)0x0)) goto LAB_00221786;
      }
      else {
        if (poVar20->known == (object *)0x0) {
LAB_00221786:
          pcVar15 = format("# Opening a \'%s\' at (%d,%d)",pbVar2->kind->name,(ulong)pbVar2->y,
                           (ulong)pbVar2->x);
          borg_note(pcVar15);
          kVar23 = 0x6f;
LAB_002217b2:
          borg_keypress(kVar23);
          borg_queue_direction(wVar11 + L'0');
          return true;
        }
        if (borg_cfg[0x16] <= borg.trait[0x38] - (int)sVar4) {
          pcVar15 = format("# Disarming a \'%s\' at (%d,%d)",pbVar2->kind->name,(ulong)pbVar2->y,
                           (ulong)pbVar2->x);
          borg_note(pcVar15);
          kVar23 = 0x44;
          goto LAB_002217b2;
        }
      }
LAB_002212b0:
      if ((pbVar2->orbed == false) && ((uint)(pbVar2->tval + L'\xfffffffe') < 0x14)) {
        lVar18 = loc((uint)pbVar2->x,(uint)pbVar2->y);
        grid2.y = borg.c.y;
        grid2.x = borg.c.x;
        wVar24 = distance(lVar18,grid2);
        if ((wVar24 == L'\x01') && (_Var8 = borg_spell_okay_fail(ORB_OF_DRAINING,L'\x19'), _Var8)) {
          lVar18 = loc((uint)pbVar2->x,(uint)pbVar2->y);
          borg_target(lVar18);
          borg_spell(ORB_OF_DRAINING);
          borg_note("# Orbing an object to check for cursed item.");
          borg_keypress(0x35);
          pbVar2->orbed = true;
          lVar25 = 0;
          do {
            pcVar7 = cave;
            lVar13 = (long)*(short *)((long)borg_ddx_ddd + lVar25) + (ulong)pbVar2->x;
            lVar22 = (long)*(short *)((long)borg_ddy_ddd + lVar25) + (ulong)pbVar2->y;
            lVar19 = (loc)loc((int)lVar13,(int)lVar22);
            _Var8 = square_in_bounds_fully(pcVar7,lVar19);
            if ((_Var8) && ((ulong)borg_grids[lVar22][lVar13].take != 0)) {
              borg_takes[borg_grids[lVar22][lVar13].take].orbed = true;
            }
            lVar25 = lVar25 + 2;
          } while (lVar25 != 0x30);
          return true;
        }
      }
      pcVar15 = format("# Walking onto and deleting a \'%s\' at (%d,%d)",pbVar2->kind->name,
                       (ulong)pbVar2->y,(ulong)pbVar2->x);
      borg_note(pcVar15);
      borg_delete_take((uint)pbVar1->take);
    }
  }
  else {
    uVar6 = borg_kills[uVar16].r_idx;
    if ((((uVar6 == 0) || ((int)(z_info->r_max - 1) <= (int)(uint)uVar6)) || (borg.trait[0x71] != 0)
        ) || ((borg.trait[0xba] != 0 ||
              (((_Var8 = flag_has_dbg(r_info[(uint)uVar6].flags,0xb,1,"r_info[kill->r_idx].flags",
                                      "RF_UNIQUE"), _Var8 && (borg.trait[0x69] == 0)) &&
               (borg.trait[0x23] < 5)))))) goto LAB_00221063;
    pbVar31 = pbVar31 + uVar16;
    pcVar15 = borg_race_name((uint)pbVar31->r_idx);
    pcVar15 = format("# Walking into a \'%s\' at (%d,%d)",pcVar15,(ulong)(uint)(pbVar31->pos).y,
                     (ulong)(uint)(pbVar31->pos).x);
    borg_note(pcVar15);
    if (my_no_alter == true) {
      borg_keypress(0x3b);
      my_no_alter = false;
    }
    else {
      borg_keypress(0x2b);
    }
  }
  kVar23 = wVar11 + L'0';
LAB_002214c6:
  borg_keypress(kVar23);
  return true;
}

Assistant:

bool borg_flow_old(int why)
{
    int x, y;

    /* Continue */
    if (borg.goal.type == why) {
        int b_n = 0;

        int i, b_i = -1;

        int c, b_c;

        /* Flow cost of current grid */
        b_c = borg_data_flow->data[borg.c.y][borg.c.x] * 10;

        /* Prevent loops */
        b_c = b_c - 5;

        /* Look around */
        for (i = 0; i < 8; i++) {
            /* Grid in that direction */
            x = borg.c.x + ddx_ddd[i];
            y = borg.c.y + ddy_ddd[i];

            /* Flow cost at that grid */
            c = borg_data_flow->data[y][x] * 10;

            /* Never backtrack */
            if (c > b_c)
                continue;

            /* avoid screen edges */
            if (x > AUTO_MAX_X - 1 || x < 1 || y > AUTO_MAX_Y - 1 || y < 1)
                continue;

            /* Notice new best value */
            if (c < b_c)
                b_n = 0;

            /* Apply the randomizer to equivalent values */
            if (borg.trait[BI_CDEPTH] == 0 && (++b_n >= 2)
                && (randint0(b_n) != 0))
                continue;
            else if (borg.trait[BI_CDEPTH] >= 1 && ++b_n >= 2)
                continue;

            /* Special case when digging anti-summon corridor */
            if (borg.goal.type == GOAL_DIGGING
                && (ddx_ddd[i] == 0 || ddy_ddd[i] == 0)) {
                /* No straight lines */
                if (distance(borg.c, loc(borg_flow_x[0], borg_flow_y[0])) <= 2)
                    continue;
            }

            /* Track it */
            b_i = i;
            b_c = c;
        }

        /* Try it */
        if (b_i >= 0) {
            /* Access the location */
            x = borg.c.x + ddx_ddd[b_i];
            y = borg.c.y + ddy_ddd[b_i];

            /* Attempt motion */
            if (borg_play_step(y, x))
                return true;
        }

        /* Mark a timestamp to wait on a anti-summon spot for a few turns */
        if (borg.goal.type == GOAL_DIGGING && borg.c.y == borg_flow_y[0]
            && borg.c.x == borg_flow_x[0])
            borg_t_antisummon = borg_t;

        /* Cancel goal */
        borg.goal.type = 0;
    }

    /* Nothing to do */
    return false;
}